

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex1D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  anon_struct_8_44_94931171_for_Info aVar5;
  GMM_PLATFORM_INFO *pGVar6;
  uint32_t NumSamples;
  GMM_STATUS GVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint32_t local_68;
  uint32_t local_64;
  uint32_t CompressHeight;
  uint32_t CompressDepth;
  __GMM_BUFFER_TYPE *local_58;
  GMM_PLATFORM_INFO *local_50;
  ulong local_48;
  uint local_40;
  uint local_3c;
  uint32_t CompressWidth;
  uint8_t local_31;
  
  GVar7 = GMM_ERROR;
  if (pRestrictions != (__GMM_BUFFER_TYPE *)0x0 && pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    aVar5 = (anon_struct_8_44_94931171_for_Info)
            ((ulong)(pTexInfo->Flags).Info & 0xfffffff3fff7ffff | 0x80000);
    (pTexInfo->Flags).Info = aVar5;
    uVar8 = 0xffffffe3ffffffff;
    if (((uint)(((this->super_GmmTextureCalc).pGmmLibContext)->SkuTable).field_0 & 0x40) == 0) {
      uVar8 = 0xfffff7f3ffffffff;
    }
    (pTexInfo->Flags).Info = (anon_struct_8_44_94931171_for_Info)(uVar8 & (ulong)aVar5);
    pGVar6 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    CompressWidth = pTexInfo->ArraySize;
    local_3c = CompressWidth + (CompressWidth == 0);
    local_48 = (ulong)pTexInfo->BitsPerPixel;
    uVar9 = (pTexInfo->Alignment).HAlign;
    local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pTexInfo->Format,&local_40,&local_68,&local_64);
    if ((*(ushort *)&(pTexInfo->Flags).Info.field_0x4 & 0x1060) != 0) {
      GmmTextureCalc::FindMipTailStartLod(&this->super_GmmTextureCalc,pTexInfo);
    }
    if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
      uVar3 = 1;
    }
    else {
      uVar3 = (pTexInfo->MSAA).NumSamples;
    }
    local_58 = pRestrictions;
    uVar3 = GmmTextureCalc::ExpandWidth
                      (&this->super_GmmTextureCalc,(uint32_t)pTexInfo->BaseWidth,uVar9,uVar3);
    local_50 = pGVar6;
    if (((((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) ||
        (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) &&
       (pTexInfo->MaxLod != 0)) {
      _CompressHeight = pGVar6->TileInfo;
      uVar8 = 1;
      do {
        if ((((ulong)(pTexInfo->Flags).Info & 0x106000000000) == 0) ||
           ((uint32_t)uVar8 != (pTexInfo->Alignment).MipTailStartLod)) {
          uVar4 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x18])(this,pTexInfo,uVar8);
          if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
            NumSamples = 1;
          }
          else {
            NumSamples = (pTexInfo->MSAA).NumSamples;
          }
          uVar4 = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,uVar4,uVar9,NumSamples);
          bVar2 = true;
          if (local_31 != '\0') {
            uVar4 = uVar4 / local_40;
          }
        }
        else {
          uVar4 = _CompressHeight[pTexInfo->TileMode].LogicalTileWidth;
          bVar2 = false;
        }
        uVar3 = uVar3 + uVar4;
      } while ((bVar2) &&
              (uVar10 = (uint32_t)uVar8 + 1, uVar8 = (ulong)uVar10, uVar10 <= pTexInfo->MaxLod));
    }
    uVar4 = 0;
    if (1 < CompressWidth) {
      uVar4 = uVar3;
    }
    (pTexInfo->Alignment).QPitch = -uVar9 & (uVar9 - 1) + uVar4;
    pTexInfo->Pitch = 0;
    uVar8 = (ulong)local_3c * (ulong)(((uint)(local_48 >> 3) & 0x1fffffff) * uVar3) + 0xfff &
            0xfffffffffffff000;
    bVar2 = local_50->SurfaceMaxSize < (long)uVar8;
    if (!bVar2) {
      pTexInfo->Size = uVar8;
      Fill1DTexOffsetAddress(this,pTexInfo);
    }
    GVar7 = (GMM_STATUS)bVar2;
    uVar10 = (pTexInfo->Alignment).BaseAlignment;
    if ((uVar10 == 0) || (uVar1 = local_58->Alignment, uVar1 % uVar10 == 0)) {
      uVar9 = local_58->Alignment;
    }
    else {
      if (uVar10 % uVar1 == 0) {
        return GVar7;
      }
      uVar9 = uVar1 * uVar10;
    }
    (pTexInfo->Alignment).BaseAlignment = uVar9;
  }
  return GVar7;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex1D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   ArraySize, BitsPerPixel, HAlign, i, Width, MipWidth;
    int64_t    Size;
    GMM_STATUS Status = GMM_SUCCESS;
    uint8_t    Compressed;
    uint32_t   CompressHeight, CompressWidth, CompressDepth;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);
    __GMM_ASSERT(pTexInfo->Flags.Info.Linear ||
                 pTexInfo->Flags.Info.TiledYf ||
                 GMM_IS_64KB_TILE(pTexInfo->Flags));

    pTexInfo->Flags.Info.Linear = 1;
    pTexInfo->Flags.Info.TiledW = 0;
    pTexInfo->Flags.Info.TiledX = 0;
    GMM_SET_4KB_TILE(pTexInfo->Flags, 0, pGmmLibContext);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    ArraySize    = GFX_MAX(pTexInfo->ArraySize, 1);
    BitsPerPixel = pTexInfo->BitsPerPixel;
    HAlign       = pTexInfo->Alignment.HAlign;

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    if(pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags))
    {
        FindMipTailStartLod(pTexInfo);
    }

    /////////////////////////////
    // Calculate Surface QPitch
    /////////////////////////////

    Width    = __GMM_EXPAND_WIDTH(this, GFX_ULONG_CAST(pTexInfo->BaseWidth), HAlign, pTexInfo);
    MipWidth = Width;

    if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Width is already aligned.
    }
    else
    {
        for(i = 1; i <= pTexInfo->MaxLod; i++)
        {
            uint32_t AlignedMipWidth;

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                Width += pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
                break;
            }
            else
            {
                MipWidth = GFX_ULONG_CAST(GmmTexGetMipWidth(pTexInfo, i));

                AlignedMipWidth = __GMM_EXPAND_WIDTH(this, MipWidth, HAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedMipWidth /= CompressWidth;
                }

                Width += AlignedMipWidth;
            }
        }
    }

    pTexInfo->Alignment.QPitch = GFX_ALIGN((ArraySize > 1) ? Width : 0, HAlign); // in pixels

    pTexInfo->Pitch = 0;

    ///////////////////////////
    // Calculate Surface Size
    ///////////////////////////

    Width *= BitsPerPixel >> 3;

    Size = GFX_ALIGN((uint64_t)Width * ArraySize, PAGE_SIZE);

    if(Size <= pPlatform->SurfaceMaxSize)
    {
        pTexInfo->Size = Size;

        Fill1DTexOffsetAddress(pTexInfo);
    }
    else
    {
        GMM_ASSERTDPF(0, "Surface too large!");
        Status = GMM_ERROR;
    }

    //////////////////////
    // Surface Alignment
    //////////////////////

    if(!pTexInfo->Alignment.BaseAlignment || __GMM_IS_ALIGN(pRestrictions->Alignment, pTexInfo->Alignment.BaseAlignment))
    {
        pTexInfo->Alignment.BaseAlignment = pRestrictions->Alignment;
    }
    else if(__GMM_IS_ALIGN(pTexInfo->Alignment.BaseAlignment, pRestrictions->Alignment))
    {
        // Do nothing: pTexInfo->Alignment.BaseAlignment is properly aligned
    }
    else
    {
        pTexInfo->Alignment.BaseAlignment = pTexInfo->Alignment.BaseAlignment * pRestrictions->Alignment;
        GMM_ASSERTDPF(0,
                      "Client requested alignment that is not properly aligned to HW requirements."
                      "Alignment is going to be much higher to match both client and HW requirements.\r\n");
    }

    GMM_DPF_EXIT;

    return (Status);
}